

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O3

void __thiscall Vector::appendValue(Vector *this,long l)

{
  long *__ptr;
  ulong uVar1;
  ulong uVar2;
  
  __ptr = this->vData;
  uVar1 = this->vLength;
  if (uVar1 == this->vaLength) {
    uVar2 = uVar1 >> 3;
    if ((long)(uVar1 >> 3) < vDefaultBoost) {
      uVar2 = vDefaultBoost;
    }
    this->vaLength = uVar2 + uVar1;
    __ptr = (long *)realloc(__ptr,(uVar2 + uVar1) * 8);
    this->vData = __ptr;
    uVar1 = this->vLength;
  }
  this->vLength = uVar1 + 1;
  __ptr[uVar1] = l;
  return;
}

Assistant:

void Vector::appendValue(const long l) {
  long addThis;
  if (vLength == vaLength) {
    addThis = vaLength / 8;
    if (Vector::vDefaultBoost > addThis)
      addThis = Vector::vDefaultBoost;
    vaLength += addThis;
    vData = (long *)realloc(vData, sizeof(long) * vaLength);
  }
  vData[vLength++] = l;
}